

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureLogOut_NotLoggedOn_LogoutNotSent::
TestsessionFixtureLogOut_NotLoggedOn_LogoutNotSent
          (TestsessionFixtureLogOut_NotLoggedOn_LogoutNotSent *this)

{
  char *suiteName;
  TestsessionFixtureLogOut_NotLoggedOn_LogoutNotSent *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"LogOut_NotLoggedOn_LogoutNotSent",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x723);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestsessionFixtureLogOut_NotLoggedOn_LogoutNotSent_0045af70;
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, LogOut_NotLoggedOn_LogoutNotSent) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(0, 0, 31);

  UtcTimeStamp time;
  object->setResponder( this );

  object->logout("test_logout");
  object->next();
  CHECK(!object->sentLogout());
}